

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  uint uVar1;
  l_uint32 fwanted;
  int nres_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  uVar1 = ci->callstatus;
  if ((L->hookmask != 0) && ((uVar1 & 0x40000) == 0)) {
    rethook(L,ci,nres);
  }
  moveresults(L,(ci->func).p,nres,uVar1 & 0x400ff);
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  l_uint32 fwanted = ci->callstatus & (CIST_TBC | CIST_NRESULTS);
  if (l_unlikely(L->hookmask) && !(fwanted & CIST_TBC))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, fwanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}